

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

uintptr_t NodeParamMeta(nodeclass *Class,uint_fast32_t Meta,dataid Id,node *Node)

{
  uint_fast32_t *puVar1;
  uint_fast32_t uVar2;
  long lVar3;
  long lVar4;
  nodecontext *Context;
  nodeclass *MainClass;
  nodemeta *m;
  uintptr_t Data;
  node *Node_local;
  dataid Id_local;
  uint_fast32_t Meta_local;
  nodeclass *Class_local;
  
  Data = (uintptr_t)Node;
  Node_local = (node *)Id;
  Id_local = Meta;
  Meta_local = (uint_fast32_t)Class;
  do {
    if (Meta_local == 0) {
      return 0;
    }
    if (*(long *)(Meta_local + 8) != 0) {
      for (MainClass = *(nodeclass **)(Meta_local + 8); (MainClass->FourCC & 0xff) != 0;
          MainClass = (nodeclass *)&MainClass->Module) {
        if ((node *)(ulong)(MainClass->FourCC >> 8) == Node_local) {
          if ((MainClass->FourCC & 0xff) == Id_local) {
            return (uintptr_t)MainClass->Meta;
          }
          if (((MainClass->FourCC & 0xff) == 0x32) &&
             (lVar3 = (*(code *)MainClass->Meta)(Data,Node_local,Id_local,&m), lVar3 != 0)) {
            return (uintptr_t)m;
          }
        }
      }
    }
    uVar2 = Meta_local;
    if (Id_local == 0x2c) {
      lVar3 = *(long *)(Meta_local + 0x48);
      while (Meta_local = *(uint_fast32_t *)(Meta_local + 0x18), Meta_local != 0) {
        if (*(long *)(Meta_local + 8) != 0) {
          for (MainClass = *(nodeclass **)(Meta_local + 8); (MainClass->FourCC & 0xff) != 0;
              MainClass = (nodeclass *)&MainClass->Module) {
            if ((((node *)(ulong)(MainClass->FourCC >> 8) == Node_local) &&
                ((MainClass->FourCC & 0xff) == 0x32)) &&
               (lVar4 = (*(code *)MainClass->Meta)(Data,Node_local,Id_local,&m), lVar4 != 0)) {
              return (uintptr_t)m;
            }
          }
        }
      }
      Meta_local = uVar2;
      if (*(long *)(lVar3 + 0xa0) != 0) {
        while ((m = (nodemeta *)
                    (**(code **)(lVar3 + 0xa0))
                              (lVar3,*(undefined4 *)(Meta_local + 0x50),
                               (ulong)Node_local & 0xffffffff), m == (nodemeta *)0x0 ||
               (m->field_0x0 == '\0'))) {
          puVar1 = (uint_fast32_t *)(Meta_local + 0x18);
          Meta_local = *puVar1;
          if (*puVar1 == 0) {
            Class_local = (nodeclass *)0x1764e2;
            return (uintptr_t)Class_local;
          }
        }
        return (uintptr_t)m;
      }
    }
    Meta_local = *(uint_fast32_t *)(uVar2 + 0x18);
  } while( true );
}

Assistant:

static uintptr_t NOINLINE NodeParamMeta(const nodeclass* Class, uint_fast32_t Meta, dataid Id, const node* Node)
{
    uintptr_t Data;
    const nodemeta* m;

    for (;Class;Class=Class->ParentClass)
    {
        if (Class->Meta) // should be registered, just fail safe
            for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                if (m->Id == Id)
                {
                    if (m->Meta == Meta)
                        return m->Data;
                    if (m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                        return Data;
                }

        if (Meta == META_PARAM_STRING)
        {
            const nodeclass* MainClass = Class;
            nodecontext* Context = NodeClass_Context(Class);

            // only check for META_PARAM_META...
            while ((Class=Class->ParentClass)!=NULL)
            {
                if (Class->Meta) // should be registered, just fail safe
                    for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                        if (m->Id == Id && m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                            return Data;
            }

            Class = MainClass;
            if (Context->ExternalStr)
            {
                do {
                    Data = (uintptr_t)Context->ExternalStr(Context,NodeClass_ClassId(Class),(int)Id);
                    if (Data!=0 && *((const tchar_t*)Data))
                        return Data;
                } while ((Class=Class->ParentClass)!=NULL);
                return (uintptr_t)T("");
            }
        }
    }
    return 0;
}